

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O2

bool __thiscall LTACMasterdataChannel::InsertRequest(LTACMasterdataChannel *this,acStatUpdateTy *r)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Rb_tree_const_iterator<acStatUpdateTy> _Var3;
  byte bVar4;
  pair<std::_Rb_tree_iterator<acStatUpdateTy>,_bool> pVar5;
  
  std::recursive_mutex::lock(&mtxMaster);
  p_Var1 = &(this->setAcStatRequ)._M_t._M_impl.super__Rb_tree_header;
  _Var3 = std::
          __find_if<std::_Rb_tree_const_iterator<acStatUpdateTy>,__gnu_cxx::__ops::_Iter_equals_val<acStatUpdateTy_const>>
                    ((this->setAcStatRequ)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                     p_Var1,r);
  if ((_Rb_tree_header *)_Var3._M_node == p_Var1) {
    pVar5 = std::
            _Rb_tree<acStatUpdateTy,acStatUpdateTy,std::_Identity<acStatUpdateTy>,std::less<acStatUpdateTy>,std::allocator<acStatUpdateTy>>
            ::_M_insert_unique<acStatUpdateTy_const&>
                      ((_Rb_tree<acStatUpdateTy,acStatUpdateTy,std::_Identity<acStatUpdateTy>,std::less<acStatUpdateTy>,std::allocator<acStatUpdateTy>>
                        *)&this->setAcStatRequ,r);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      bVar2 = true;
    }
    else {
      std::condition_variable::notify_all();
      r = (acStatUpdateTy *)0x1;
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
    r = (acStatUpdateTy *)0x0;
  }
  bVar4 = (byte)r;
  pthread_mutex_unlock((pthread_mutex_t *)&mtxMaster);
  if (bVar2) {
    bVar4 = 0;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool LTACMasterdataChannel::InsertRequest (const acStatUpdateTy& r)
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        
        // Avoid double entry: Bail if the same kind of request exists already
        // This is different from the duplication check that std::set::insert does
        // because it uses operator== (ignoring `distance`) instead operator<
        if (std::find(setAcStatRequ.begin(), setAcStatRequ.end(), r) != setAcStatRequ.end())
            return false;
        
        // Add the new request to the set and trigger the main loop if really inserted
        if (setAcStatRequ.insert(r).second) {
            FDThreadSynchCV.notify_all();
            return true;
        }
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
    return false;

}